

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

bool __thiscall
SymbolTable::addEquation
          (SymbolTable *this,wstring *name,uint file,uint section,wstring *replacement)

{
  pointer pwVar1;
  pointer pEVar2;
  bool bVar3;
  uint *puVar4;
  mapped_type *pmVar5;
  SymbolKey key;
  Equation equation;
  uint local_b8;
  uint local_b4;
  wstring *local_b0;
  pointer local_a8;
  key_type local_a0;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  wchar_t local_48 [4];
  uint local_38;
  uint local_34;
  
  puVar4 = &local_b8;
  local_b8 = section;
  local_b4 = file;
  bVar3 = isValidSymbolName(name);
  if ((!bVar3) || (bVar3 = symbolExists(this,name,file,section), bVar3)) {
    return false;
  }
  pwVar1 = (name->_M_dataplus)._M_p;
  if (*pwVar1 == L'@') {
    if (pwVar1[1] == L'@') goto LAB_00134d59;
  }
  else {
    local_b8 = 0xffffffff;
    puVar4 = &local_b4;
  }
  *puVar4 = 0xffffffff;
  section = local_b8;
  file = local_b4;
LAB_00134d59:
  local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
  local_b0 = replacement;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_a0,pwVar1,pwVar1 + name->_M_string_length);
  local_a8 = (this->equations).
             super__Vector_base<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->equations).
           super__Vector_base<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_a0.file = file;
  local_a0.section = section;
  pmVar5 = std::
           map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
           ::operator[](&this->symbols,&local_a0);
  pmVar5->type = EquationSymbol;
  pmVar5->index = ((long)pEVar2 - (long)local_a8 >> 3) * -0x71c71c71c71c71c7;
  pwVar1 = (name->_M_dataplus)._M_p;
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)local_78,pwVar1,pwVar1 + name->_M_string_length);
  pwVar1 = (local_b0->_M_dataplus)._M_p;
  local_58._M_p = local_48;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_58,pwVar1,pwVar1 + local_b0->_M_string_length);
  local_38 = file;
  local_34 = section;
  std::vector<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>::push_back
            (&this->equations,(value_type *)local_78);
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool SymbolTable::addEquation(const std::wstring& name, unsigned int file, unsigned int section, std::wstring& replacement)
{
	if (isValidSymbolName(name) == false)
		return false;

	if (symbolExists(name,file,section))
		return false;
	
	setFileSectionValues(name,file,section);

	SymbolKey key = { name, file, section };
	SymbolInfo value = { EquationSymbol, equations.size() };
	symbols[key] = value;

	Equation equation = { name, replacement, file, section };
	equations.push_back(equation);
	return true;
}